

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer.cpp
# Opt level: O2

void __thiscall Randomizer::Randomizer(Randomizer *this)

{
  result_type __sd;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  param_type *ppVar1;
  param_type *ppVar2;
  
  __sd = std::chrono::_V2::system_clock::now();
  this_00 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             *)operator_new(5000);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(this_00,__sd);
  this->RndCore = this_00;
  ppVar1 = (param_type *)operator_new(8);
  ppVar1->_M_a = 0.0;
  ppVar1->_M_b = 60.0;
  this->XAxisRnd = (uniform_real_distribution<float> *)ppVar1;
  ppVar1 = (param_type *)operator_new(8);
  ppVar1->_M_a = 0.0;
  ppVar1->_M_b = 90.0;
  this->YAxisRnd = (uniform_real_distribution<float> *)ppVar1;
  ppVar1 = (param_type *)operator_new(8);
  ppVar1->_M_a = 0.0;
  ppVar1->_M_b = 362880.0;
  this->RespawnRnd = (uniform_real_distribution<float> *)ppVar1;
  ppVar2 = (param_type *)operator_new(8);
  ppVar2->_M_a = 10;
  ppVar2->_M_b = 0x14;
  this->WanderRnd = (uniform_int_distribution<int> *)ppVar2;
  return;
}

Assistant:

Randomizer::Randomizer()
{
    auto seed = chrono::system_clock::now().time_since_epoch().count();
    RndCore = new mt19937(seed);
    XAxisRnd = new uniform_real_distribution<float>(0, MapWidth);
    YAxisRnd = new uniform_real_distribution<float>(0, MapHeight);
    RespawnRnd = new uniform_real_distribution<float>(0, RespawnRndMax);
    WanderRnd = new uniform_int_distribution<int>(WanderIntervalLB, WanderIntervalUB);
}